

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transporter.cpp
# Opt level: O2

bool Transporter::ParseSocketAddress(string *host,int port,sockaddr_storage *addr,string *err)

{
  char *hostname;
  int err_00;
  uv_loop_t *loop;
  uv_getaddrinfo_t resolver;
  string local_f0;
  uv_getaddrinfo_t local_d0;
  
  loop = uv_default_loop();
  hostname = (host->_M_dataplus)._M_p;
  std::__cxx11::to_string(&local_f0,port);
  err_00 = uv_getaddrinfo(loop,&local_d0,(uv_getaddrinfo_cb)0x0,hostname,local_f0._M_dataplus._M_p,
                          (addrinfo *)0x0);
  std::__cxx11::string::~string((string *)&local_f0);
  if (err_00 == 0) {
    memcpy(addr,(local_d0.addrinfo)->ai_addr,(ulong)(local_d0.addrinfo)->ai_addrlen);
    uv_freeaddrinfo(local_d0.addrinfo);
  }
  else {
    std::__cxx11::string::assign((char *)err);
    uv_strerror(err_00);
    std::__cxx11::string::append((char *)err);
  }
  return err_00 == 0;
}

Assistant:

bool Transporter::ParseSocketAddress(const std::string &host, int port, sockaddr_storage *addr, std::string &err) 
{
	auto const loop = uv_default_loop();
	uv_getaddrinfo_t resolver;
	int res = uv_getaddrinfo(loop, &resolver, nullptr, host.c_str(),
	                         std::to_string(port).c_str(), nullptr);
	if (res != 0) {
		err = "Invalid host: ";
		err += uv_strerror(res);
		return false;
	}
	memcpy(addr, resolver.addrinfo->ai_addr, resolver.addrinfo->ai_addrlen);
	uv_freeaddrinfo(resolver.addrinfo);
	return true;
}